

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.c
# Opt level: O2

int parseInteger(char *str,int start,int len)

{
  char cVar1;
  bool bVar2;
  ushort **ppuVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  byte bVar7;
  
  if (start < 0 || str == (char *)0x0) {
    return 0;
  }
  iVar4 = 0;
  bVar2 = false;
  bVar7 = 0;
  pcVar6 = str + (uint)start;
  while (pcVar5 = pcVar6 + 1, 0 < len) {
    cVar1 = *pcVar6;
    if ((long)cVar1 == 0) break;
    pcVar6 = pcVar5;
    if ((byte)(cVar1 - 0x30U) < 10) {
      iVar4 = (uint)(byte)(cVar1 - 0x30U) + iVar4 * 10;
      len = len + -1;
      bVar7 = 1;
    }
    else if (cVar1 != '+' || bVar7 != 0) {
      if ((~bVar7 & cVar1 == '-') == 0) {
        ppuVar3 = __ctype_b_loc();
        if ((byte)(~bVar7 & (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) >> 5) != 0)
        goto LAB_00126625;
        break;
      }
      len = len + -1;
      bVar7 = 1;
      bVar2 = true;
    }
    else {
LAB_00126625:
      bVar7 = (cVar1 != '+' | bVar7) ^ 1;
      len = len + -1;
    }
  }
  if (bVar2) {
    return -iVar4;
  }
  return iVar4;
}

Assistant:

int parseInteger(char *str, int start, int len) {
   register int value = 0;
   register char ch;
   int neg = 0, inside = 0;

   if (!str || start < 0) { return 0; }
   str += start;

   while((len-- > 0) && *str) {
      ch = *str++;
      if ((ch >='0') && (ch <= '9')) {
	 value = (10*value) + (ch - '0');
	 inside = 1;
      }
      else if (ch == '+' && !inside) {
	 inside = 1;
      }
      else if (ch == '-' && !inside) {
	 neg = 1;
	 inside = 1;
      }
      else if (isspace(ch) && !inside) { /* nothing */ }
      else break; /* end of integer */
   }
   return (neg?-value:value);
}